

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# microui.c
# Opt level: O3

void mu_draw_rect(mu_Context *ctx,mu_Rect rect,mu_Color color)

{
  uint uVar1;
  mu_Command *pmVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  ulong uVar8;
  int iVar9;
  mu_Vec2 mVar10;
  mu_Rect mVar11;
  
  mVar11 = mu_get_clip_rect(ctx);
  uVar8 = mVar11._0_8_ >> 0x20;
  uVar1 = mVar11.x;
  uVar7 = mVar11.w + uVar1;
  uVar4 = rect.x;
  if ((int)uVar1 < (int)uVar4) {
    uVar1 = uVar4;
  }
  uVar6 = rect.y;
  if (mVar11.y < (int)uVar6) {
    uVar8 = (ulong)uVar6;
  }
  iVar3 = (int)uVar8;
  uVar4 = rect.w + uVar4;
  if ((int)uVar4 < (int)uVar7) {
    uVar7 = uVar4;
  }
  iVar5 = rect.h + uVar6;
  iVar9 = mVar11.h + mVar11.y;
  if (iVar5 < iVar9) {
    iVar9 = iVar5;
  }
  if ((int)uVar7 <= (int)uVar1) {
    uVar7 = uVar1;
  }
  if (iVar9 <= iVar3) {
    iVar9 = iVar3;
  }
  if ((uVar7 - uVar1 != 0 && (int)uVar1 <= (int)uVar7) && (0 < iVar9 - iVar3)) {
    mVar10.y = iVar9 - iVar3;
    mVar10.x = uVar7 - uVar1;
    pmVar2 = mu_push_command(ctx,3,0x1c);
    (pmVar2->jump).dst = (void *)((ulong)uVar1 | uVar8 << 0x20);
    (pmVar2->text).pos = mVar10;
    (pmVar2->rect).color = color;
  }
  return;
}

Assistant:

void mu_draw_rect(mu_Context *ctx, mu_Rect rect, mu_Color color) {
  mu_Command *cmd;
  rect = intersect_rects(rect, mu_get_clip_rect(ctx));
  if (rect.w > 0 && rect.h > 0) {
    cmd = mu_push_command(ctx, MU_COMMAND_RECT, sizeof(mu_RectCommand));
    cmd->rect.rect = rect;
    cmd->rect.color = color;
  }
}